

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMImage * MT32Emu::ROMImage::interleaveImages(ROMImage *romImageEven,ROMImage *romImageOdd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  File *pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Bit8u *data_00;
  ROMInfo *pRVar6;
  undefined1 *puVar7;
  ROMImage *romImageFull;
  size_t romDataIx;
  Bit8u *writePtr;
  Bit8u *data;
  size_t partSize;
  Bit8u *romDataOdd;
  Bit8u *romDataEven;
  ROMImage *romImageOdd_local;
  ROMImage *romImageEven_local;
  ROMImage *pRVar5;
  
  pFVar4 = getFile(romImageEven);
  iVar1 = (*pFVar4->_vptr_File[3])();
  pFVar4 = getFile(romImageOdd);
  iVar2 = (*pFVar4->_vptr_File[3])();
  pFVar4 = getFile(romImageEven);
  iVar3 = (*pFVar4->_vptr_File[2])();
  pRVar5 = (ROMImage *)CONCAT44(extraout_var_01,iVar3);
  data_00 = (Bit8u *)operator_new__((long)pRVar5 << 1);
  romDataIx = (size_t)data_00;
  for (romImageFull = (ROMImage *)0x0; romImageFull < pRVar5;
      romImageFull = (ROMImage *)((long)&romImageFull->file + 1)) {
    puVar7 = (undefined1 *)(romDataIx + 1);
    *(undefined1 *)romDataIx =
         *(undefined1 *)((long)&romImageFull->file + CONCAT44(extraout_var,iVar1));
    romDataIx = romDataIx + 2;
    *puVar7 = *(undefined1 *)((long)&romImageFull->file + CONCAT44(extraout_var_00,iVar2));
  }
  romImageEven_local = makeFullROMImage(data_00,(long)pRVar5 << 1);
  pRVar6 = getROMInfo(romImageEven_local);
  if (pRVar6 == (ROMInfo *)0x0) {
    freeROMImage(romImageEven_local);
    romImageEven_local = (ROMImage *)0x0;
  }
  return romImageEven_local;
}

Assistant:

const ROMImage *ROMImage::interleaveImages(const ROMImage *romImageEven, const ROMImage *romImageOdd) {
	const Bit8u *romDataEven = romImageEven->getFile()->getData();
	const Bit8u *romDataOdd = romImageOdd->getFile()->getData();
	size_t partSize = romImageEven->getFile()->getSize();
	Bit8u *data = new Bit8u[2 * partSize];
	Bit8u *writePtr = data;
	for (size_t romDataIx = 0; romDataIx < partSize; romDataIx++) {
		*(writePtr++) = romDataEven[romDataIx];
		*(writePtr++) = romDataOdd[romDataIx];
	}
	const ROMImage *romImageFull = makeFullROMImage(data, 2 * partSize);
	if (romImageFull->getROMInfo() == NULL) {
		freeROMImage(romImageFull);
		return NULL;
	}
	return romImageFull;
}